

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2loop.cc
# Opt level: O0

S2Point * __thiscall
S2Loop::ProjectToBoundary(S2Point *__return_storage_ptr__,S2Loop *this,S2Point *x)

{
  Options *this_00;
  Result RVar1;
  undefined1 local_368 [8];
  Result edge;
  undefined1 local_348 [8];
  PointTarget target;
  S2ClosestEdgeQuery q;
  Options options;
  S2Point *x_local;
  S2Loop *this_local;
  
  this_00 = (Options *)
            &q.base_.initial_cells_.super__Vector_base<S2CellId,_std::allocator<S2CellId>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  S2ClosestEdgeQuery::Options::Options((Options *)this_00);
  S2ClosestEdgeQueryBase<S2MinDistance>::Options::set_include_interiors(this_00,false);
  S2ClosestEdgeQuery::S2ClosestEdgeQuery
            ((S2ClosestEdgeQuery *)(target.super_S2MinDistancePointTarget.point_.c_ + 2),
             &(this->index_).super_S2ShapeIndex,(Options *)this_00);
  S2ClosestEdgeQuery::PointTarget::PointTarget((PointTarget *)local_348,x);
  RVar1 = S2ClosestEdgeQuery::FindClosestEdge
                    ((S2ClosestEdgeQuery *)(target.super_S2MinDistancePointTarget.point_.c_ + 2),
                     (Target *)local_348);
  edge.distance_.super_S1ChordAngle.length2_ = RVar1._8_8_;
  local_368 = (undefined1  [8])RVar1.distance_.super_S1ChordAngle.length2_;
  S2ClosestEdgeQuery::Project
            (__return_storage_ptr__,
             (S2ClosestEdgeQuery *)(target.super_S2MinDistancePointTarget.point_.c_ + 2),x,
             (Result *)local_368);
  S2ClosestEdgeQuery::PointTarget::~PointTarget((PointTarget *)local_348);
  S2ClosestEdgeQuery::~S2ClosestEdgeQuery
            ((S2ClosestEdgeQuery *)(target.super_S2MinDistancePointTarget.point_.c_ + 2));
  return __return_storage_ptr__;
}

Assistant:

S2Point S2Loop::ProjectToBoundary(const S2Point& x) const {
  S2ClosestEdgeQuery::Options options;
  options.set_include_interiors(false);
  S2ClosestEdgeQuery q(&index_, options);
  S2ClosestEdgeQuery::PointTarget target(x);
  S2ClosestEdgeQuery::Result edge = q.FindClosestEdge(&target);
  return q.Project(x, edge);
}